

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_string.cc
# Opt level: O0

string * Ltrim(string *s)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  unary_negate<std::pointer_to_unary_function<int,_int>_> __pred;
  string *in_RDI;
  string *__i;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd8;
  undefined8 local_20;
  undefined8 local_10;
  
  __i = in_RDI;
  std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffffb0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__i);
  __last._M_current = (char *)std::__cxx11::string::begin();
  __pred._M_pred._M_ptr = (pointer_to_unary_function<int,_int>)std::__cxx11::string::end();
  std::ptr_fun<int,int>((_func_int_int *)__i);
  std::not1<std::pointer_to_unary_function<int,int>>((pointer_to_unary_function<int,_int> *)__i);
  std::
  find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
            (in_stack_ffffffffffffffd8,__last,__pred);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffffb0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__i);
  std::__cxx11::string::erase(__i,local_10,local_20);
  return in_RDI;
}

Assistant:

std::string &Ltrim(std::string &s) {
    s.erase(s.begin(), std::find_if(s.begin(), s.end(),
                                    std::not1(std::ptr_fun<int, int>(std::isspace))));
    return s;
}